

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void automatics(tgestate_t *state)

{
  byte bVar1;
  uint8_t uVar2;
  vischar_t *pvVar3;
  char cVar4;
  
  state->entered_move_a_character = '\0';
  if (state->bell == '\0') {
    pvVar3 = state->vischars;
    cVar4 = -7;
    do {
      pvVar3 = pvVar3 + 1;
      if ((pvVar3->character < 0x14) && ((pvVar3->mi).mappos.w < 0x20)) {
        pvVar3->flags = '\x01';
      }
      cVar4 = cVar4 + '\x01';
    } while (cVar4 != '\0');
  }
  if ((state->food_discovered_counter != '\0') &&
     (uVar2 = state->food_discovered_counter + 0xff, state->food_discovered_counter = uVar2,
     uVar2 == '\0')) {
    state->item_structs[7].item_and_flags = state->item_structs[7].item_and_flags & 0xdf;
    item_discovered(state,'\a');
  }
  state->IY = state->vischars + 1;
  cVar4 = -7;
  do {
    pvVar3 = state->IY;
    if (pvVar3->flags != 0xff) {
      bVar1 = pvVar3->character;
      if (bVar1 < 0x14) {
        is_item_discoverable(state);
        if ((state->red_flag != '\0') || (state->automatic_player_counter != '\0')) {
          guards_follow_suspicious_character(state,pvVar3);
        }
        if ((0xf < bVar1) && ((char)state->item_structs[7].room_and_flags < '\0')) {
          pvVar3->flags = '\x03';
        }
      }
      character_behaviour(state,pvVar3);
    }
    state->IY = state->IY + 1;
    cVar4 = cVar4 + '\x01';
  } while (cVar4 != '\0');
  if ((state->red_flag == '\0') &&
     ((state->in_solitary != '\0' || (state->automatic_player_counter == '\0')))) {
    state->IY = state->vischars;
    character_behaviour(state,state->vischars);
    return;
  }
  return;
}

Assistant:

void automatics(tgestate_t *state)
{
  uint8_t iters; /* was B */

  assert(state != NULL);

  /* (I've still no idea what this flag means). */
  state->entered_move_a_character = 0;

  /* If the bell is ringing, hostiles pursue. */
  if (state->bell == bell_RING_PERPETUAL)
    hostiles_pursue(state);

  /* If food was dropped then count down until it is discovered. */
  if (state->food_discovered_counter != 0 &&
      --state->food_discovered_counter == 0)
  {
    /* De-poison the food. */
    state->item_structs[item_FOOD].item_and_flags &= ~itemstruct_ITEM_FLAG_POISONED;
    item_discovered(state, item_FOOD);
  }

  /* Make supporting characters react (if flags are set). */
  state->IY = &state->vischars[1];
  iters = vischars_LENGTH - 1;
  do
  {
    vischar_t *vischar; /* was IY/new local copy */

    vischar = state->IY; // cache

    if (vischar->flags != vischar_FLAGS_EMPTY_SLOT)
    {
      character_t character; /* was A */

      character = vischar->character; /* Conv: Removed redundant mask op. */
      assert(character != character_NONE);
      if (character <= character_19_GUARD_DOG_4) /* Hostile characters only. */
      {
        /* Characters 0..19. */

        is_item_discoverable(state);

        if (state->red_flag || state->automatic_player_counter > 0)
          guards_follow_suspicious_character(state, vischar);

        /* If there is (poisoned) food nearby then put the guard dogs
         * (characters 16..19) into vischar_PURSUIT_DOG_FOOD pursue mode. */
        if (character >= character_16_GUARD_DOG_1 &&
            state->item_structs[item_FOOD].room_and_flags & itemstruct_ROOM_FLAG_NEARBY_7)
            vischar->flags = vischar_PURSUIT_DOG_FOOD;
      }

      character_behaviour(state, vischar);
    }

    state->IY++;
  }
  while (--iters);

  /* Engage automatic behaviour for the hero unless the flag is red, the
   * hero is in solitary or an input event was recently received. */
  if (state->red_flag)
    return;
  if (state->in_solitary || state->automatic_player_counter == 0)
  {
    state->IY = &state->vischars[0];
    character_behaviour(state, state->IY);
  }
}